

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstracttxin.cpp
# Opt level: O3

void __thiscall
AbstractTxIn_ConstractorGetterSetter_Test::TestBody(AbstractTxIn_ConstractorGetterSetter_Test *this)

{
  AbstractTxIn *pAVar1;
  AbstractTxIn actual;
  undefined1 local_1d0 [144];
  AbstractTxIn local_140;
  AbstractTxIn local_b0;
  
  cfd::core::AbstractTxIn::AbstractTxIn
            ((AbstractTxIn *)local_1d0,&expect_txid,1,0xffffffff,&expect_unlocking_script);
  local_b0._vptr_AbstractTxIn = (_func_int **)&PTR__AbstractTxIn_004d3348;
  cfd::core::Txid::Txid(&local_b0.txid_,(Txid *)(local_1d0 + 8));
  local_b0.vout_ = local_1d0._40_4_;
  cfd::core::Script::Script(&local_b0.unlocking_script_,(Script *)(local_1d0 + 0x30));
  pAVar1 = (AbstractTxIn *)(local_1d0 + 0x78);
  local_b0.sequence_ = local_1d0._104_4_;
  local_b0.script_witness_._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_004d2f88;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (&local_b0.script_witness_.witness_stack_,
             (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)pAVar1);
  TestBody::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&local_b0,pAVar1);
  cfd::core::AbstractTxIn::~AbstractTxIn(&local_b0);
  cfd::core::AbstractTxIn::~AbstractTxIn((AbstractTxIn *)local_1d0);
  cfd::core::AbstractTxIn::AbstractTxIn((AbstractTxIn *)local_1d0,&expect_txid,1,0xffffffff);
  cfd::core::AbstractTxIn::SetUnlockingScript((Script *)local_1d0);
  local_140._vptr_AbstractTxIn = (_func_int **)&PTR__AbstractTxIn_004d3348;
  cfd::core::Txid::Txid(&local_140.txid_,(Txid *)(local_1d0 + 8));
  local_140.vout_ = local_1d0._40_4_;
  cfd::core::Script::Script(&local_140.unlocking_script_,(Script *)(local_1d0 + 0x30));
  pAVar1 = (AbstractTxIn *)(local_1d0 + 0x78);
  local_140.sequence_ = local_1d0._104_4_;
  local_140.script_witness_._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_004d2f88;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (&local_140.script_witness_.witness_stack_,
             (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)pAVar1);
  TestBody::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&local_140,pAVar1);
  cfd::core::AbstractTxIn::~AbstractTxIn(&local_140);
  cfd::core::AbstractTxIn::~AbstractTxIn((AbstractTxIn *)local_1d0);
  return;
}

Assistant:

TEST(AbstractTxIn, ConstractorGetterSetter) {
  const auto check = [](AbstractTxIn actual) -> void {
    EXPECT_STREQ(expect_txid.GetHex().c_str(),
        actual.GetTxid().GetHex().c_str());
    EXPECT_EQ(expect_index, actual.GetVout());
    EXPECT_STREQ(expect_txid.GetHex().c_str(),
        actual.GetOutPoint().GetTxid().GetHex().c_str());
    EXPECT_EQ(expect_index, actual.GetOutPoint().GetVout());
    EXPECT_EQ(expect_sequence, actual.GetSequence());
    EXPECT_STREQ(expect_script_hex.c_str(),
        actual.GetUnlockingScript().GetScript().GetHex().c_str());
  };

  {
    AbstractTxIn actual = AbstractTxIn(expect_txid, expect_index,
                                       expect_sequence,
                                       expect_unlocking_script);
    check(actual);
  }

  {
    AbstractTxIn actual = AbstractTxIn(expect_txid, expect_index,
                                       expect_sequence);
    actual.SetUnlockingScript(expect_unlocking_script);
    check(actual);
  }
}